

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

bool __thiscall leveldb::log::Reader::SkipToInitialBlock(Reader *this)

{
  bool bVar1;
  ulong uVar2;
  Reader *in_RDI;
  long in_FS_OFFSET;
  uint64_t block_start_location;
  size_t offset_in_block;
  Status skip_status;
  Status *in_stack_ffffffffffffff98;
  Status *reason;
  undefined7 in_stack_ffffffffffffffb0;
  uint64_t local_30;
  byte local_11;
  Status local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = in_RDI->initial_offset_ & 0x7fff;
  local_30 = in_RDI->initial_offset_ - uVar2;
  if (0x7ffa < uVar2) {
    local_30 = local_30 + 0x8000;
  }
  in_RDI->end_of_buffer_offset_ = local_30;
  if (local_30 != 0) {
    reason = &local_10;
    (*in_RDI->file_->_vptr_SequentialFile[3])(reason,in_RDI->file_,local_30);
    bVar1 = Status::ok(in_stack_ffffffffffffff98);
    if (!bVar1) {
      ReportDrop(in_RDI,CONCAT17(bVar1,in_stack_ffffffffffffffb0),reason);
      local_11 = 0;
    }
    Status::~Status(in_stack_ffffffffffffff98);
    if (!bVar1) goto LAB_018a529a;
  }
  local_11 = 1;
LAB_018a529a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool Reader::SkipToInitialBlock() {
  const size_t offset_in_block = initial_offset_ % kBlockSize;
  uint64_t block_start_location = initial_offset_ - offset_in_block;

  // Don't search a block if we'd be in the trailer
  if (offset_in_block > kBlockSize - 6) {
    block_start_location += kBlockSize;
  }

  end_of_buffer_offset_ = block_start_location;

  // Skip to start of first block that can contain the initial record
  if (block_start_location > 0) {
    Status skip_status = file_->Skip(block_start_location);
    if (!skip_status.ok()) {
      ReportDrop(block_start_location, skip_status);
      return false;
    }
  }

  return true;
}